

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.hpp
# Opt level: O1

void diy::
     Serialization<std::map<diy::Direction,_int,_std::less<diy::Direction>,_std::allocator<std::pair<const_diy::Direction,_int>_>_>_>
     ::load(BinaryBuffer *bb,Map *m)

{
  mapped_type *pmVar1;
  ulong uVar2;
  size_t s;
  Direction k;
  allocator<int> local_7d;
  int local_7c;
  ulong local_78;
  small_vector<int,_4UL,_0UL,_std::allocator<int>_> local_70;
  
  (*bb->_vptr_BinaryBuffer[4])(bb,&local_78,8);
  if (local_78 != 0) {
    uVar2 = 0;
    do {
      local_7c = 0;
      itlib::small_vector<int,_4UL,_0UL,_std::allocator<int>_>::small_vector
                (&local_70,0,&local_7c,&local_7d);
      Serialization<diy::DynamicPoint<int,_4UL>_>::load(bb,(Point *)&local_70);
      pmVar1 = std::
               map<diy::Direction,_int,_std::less<diy::Direction>,_std::allocator<std::pair<const_diy::Direction,_int>_>_>
               ::operator[](m,(key_type *)&local_70);
      (*bb->_vptr_BinaryBuffer[4])(bb,pmVar1,4);
      local_70.m_end = local_70.m_begin;
      if (local_70.m_dynamic_data != (pointer)0x0) {
        operator_delete(local_70.m_dynamic_data,local_70.m_dynamic_capacity << 2);
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 < local_78);
  }
  return;
}

Assistant:

static void         load(BinaryBuffer& bb, Map& m)
    {
      size_t s;
      diy::load(bb, s);
      for (size_t i = 0; i < s; ++i)
      {
        K k;
        diy::load(bb, k);
        diy::load(bb, m[k]);
      }
    }